

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemRgEa<(moira::Instr)77,(moira::Mode)7,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)2> dst;
  RegRegList src;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  Align align;
  undefined2 in_stack_ffffffffffffffcc;
  u16 in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  RegRegList in_stack_ffffffffffffffd6;
  RegRegList local_1c [6];
  StrWriter *local_10;
  
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)2>
                    ((Moira *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),in_RDI);
  RegRegList::RegRegList(local_1c,(u16)uVar1);
  Op<(moira::Mode)7,(moira::Size)2>
            ((Moira *)CONCAT26(in_stack_ffffffffffffffd6.raw,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce,
             (u32 *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  pSVar2 = StrWriter::operator<<(local_10);
  pSVar2 = StrWriter::operator<<(pSVar2);
  align.raw = in_RDI[5];
  StrWriter::operator<<(pSVar2,align);
  pSVar2 = StrWriter::operator<<
                     ((StrWriter *)
                      CONCAT26(in_stack_ffffffffffffffce,
                               CONCAT24(in_stack_ffffffffffffffcc,align.raw)),
                      in_stack_ffffffffffffffd6);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT26(in_stack_ffffffffffffffd6.raw,in_stack_ffffffffffffffd0),
             (Ea<(moira::Mode)7,_(moira::Size)2> *)
             CONCAT26(in_stack_ffffffffffffffce,CONCAT24(in_stack_ffffffffffffffcc,align.raw)));
  return;
}

Assistant:

void
Moira::dasmMovemRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = RegRegList ( dasmRead<Word>(addr)       );
    auto dst = Op <M,S>   ( _____________xxx(op), addr );

    if (M == 4) { src.raw = REVERSE_16(src.raw); }
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}